

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t
ctrl_set_svc_ref_frame_comp_pred(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  AV1_COMP *pAVar2;
  int *piVar3;
  undefined8 *local_38;
  aom_svc_ref_frame_comp_pred_t *data;
  AV1_COMP *cpi;
  __va_list_tag *args_local;
  aom_codec_alg_priv_t_conflict *ctx_local;
  
  pAVar2 = ctx->ppi->cpi;
  uVar1 = args->gp_offset;
  if (uVar1 < 0x29) {
    local_38 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    local_38 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = local_38 + 1;
  }
  piVar3 = (int *)*local_38;
  (pAVar2->ppi->rtc_ref).ref_frame_comp[0] = *piVar3;
  (pAVar2->ppi->rtc_ref).ref_frame_comp[1] = piVar3[1];
  (pAVar2->ppi->rtc_ref).ref_frame_comp[2] = piVar3[2];
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t ctrl_set_svc_ref_frame_comp_pred(
    aom_codec_alg_priv_t *ctx, va_list args) {
  AV1_COMP *const cpi = ctx->ppi->cpi;
  aom_svc_ref_frame_comp_pred_t *const data =
      va_arg(args, aom_svc_ref_frame_comp_pred_t *);
  cpi->ppi->rtc_ref.ref_frame_comp[0] = data->use_comp_pred[0];
  cpi->ppi->rtc_ref.ref_frame_comp[1] = data->use_comp_pred[1];
  cpi->ppi->rtc_ref.ref_frame_comp[2] = data->use_comp_pred[2];
  return AOM_CODEC_OK;
}